

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t avx2_despace(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 (*pauVar13) [32];
  undefined8 *puVar14;
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar15 [16];
  char c_1;
  char c;
  size_t j;
  __m256i anywhite;
  __m256i xcarriage;
  __m256i xnewline;
  __m256i xspaces;
  __m256i x;
  size_t i;
  __m256i carriage;
  __m256i newline;
  __m256i spaces;
  size_t pos;
  ulong local_428;
  ulong local_368;
  size_t local_2e8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_2e8 = 0;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar3 = vpinsrb_avx(auVar3,0x20,2);
  auVar3 = vpinsrb_avx(auVar3,0x20,3);
  auVar3 = vpinsrb_avx(auVar3,0x20,4);
  auVar3 = vpinsrb_avx(auVar3,0x20,5);
  auVar3 = vpinsrb_avx(auVar3,0x20,6);
  auVar3 = vpinsrb_avx(auVar3,0x20,7);
  auVar3 = vpinsrb_avx(auVar3,0x20,8);
  auVar3 = vpinsrb_avx(auVar3,0x20,9);
  auVar3 = vpinsrb_avx(auVar3,0x20,10);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xf);
  uStack_f0 = auVar3._0_8_;
  uStack_e8 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar3 = vpinsrb_avx(auVar3,10,2);
  auVar3 = vpinsrb_avx(auVar3,10,3);
  auVar3 = vpinsrb_avx(auVar3,10,4);
  auVar3 = vpinsrb_avx(auVar3,10,5);
  auVar3 = vpinsrb_avx(auVar3,10,6);
  auVar3 = vpinsrb_avx(auVar3,10,7);
  auVar3 = vpinsrb_avx(auVar3,10,8);
  auVar3 = vpinsrb_avx(auVar3,10,9);
  auVar3 = vpinsrb_avx(auVar3,10,10);
  auVar3 = vpinsrb_avx(auVar3,10,0xb);
  auVar3 = vpinsrb_avx(auVar3,10,0xc);
  auVar3 = vpinsrb_avx(auVar3,10,0xd);
  auVar3 = vpinsrb_avx(auVar3,10,0xe);
  auVar3 = vpinsrb_avx(auVar3,10,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar4 = vpinsrb_avx(auVar4,10,2);
  auVar4 = vpinsrb_avx(auVar4,10,3);
  auVar4 = vpinsrb_avx(auVar4,10,4);
  auVar4 = vpinsrb_avx(auVar4,10,5);
  auVar4 = vpinsrb_avx(auVar4,10,6);
  auVar4 = vpinsrb_avx(auVar4,10,7);
  auVar4 = vpinsrb_avx(auVar4,10,8);
  auVar4 = vpinsrb_avx(auVar4,10,9);
  auVar4 = vpinsrb_avx(auVar4,10,10);
  auVar4 = vpinsrb_avx(auVar4,10,0xb);
  auVar4 = vpinsrb_avx(auVar4,10,0xc);
  auVar4 = vpinsrb_avx(auVar4,10,0xd);
  auVar4 = vpinsrb_avx(auVar4,10,0xe);
  auVar4 = vpinsrb_avx(auVar4,10,0xf);
  uStack_b0 = auVar4._0_8_;
  uStack_a8 = auVar4._8_8_;
  auVar4 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar4 = vpinsrb_avx(auVar4,0xd,2);
  auVar4 = vpinsrb_avx(auVar4,0xd,3);
  auVar4 = vpinsrb_avx(auVar4,0xd,4);
  auVar4 = vpinsrb_avx(auVar4,0xd,5);
  auVar4 = vpinsrb_avx(auVar4,0xd,6);
  auVar4 = vpinsrb_avx(auVar4,0xd,7);
  auVar4 = vpinsrb_avx(auVar4,0xd,8);
  auVar4 = vpinsrb_avx(auVar4,0xd,9);
  auVar4 = vpinsrb_avx(auVar4,0xd,10);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xb);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xe);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar5 = vpinsrb_avx(auVar5,0xd,2);
  auVar5 = vpinsrb_avx(auVar5,0xd,3);
  auVar5 = vpinsrb_avx(auVar5,0xd,4);
  auVar5 = vpinsrb_avx(auVar5,0xd,5);
  auVar5 = vpinsrb_avx(auVar5,0xd,6);
  auVar5 = vpinsrb_avx(auVar5,0xd,7);
  auVar5 = vpinsrb_avx(auVar5,0xd,8);
  auVar5 = vpinsrb_avx(auVar5,0xd,9);
  auVar5 = vpinsrb_avx(auVar5,0xd,10);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xb);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xe);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xf);
  auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_70 = auVar15._0_8_;
  uStack_68 = auVar15._8_8_;
  for (local_368 = 0; local_368 + 0x1f < in_RSI; local_368 = local_368 + 0x20) {
    pauVar13 = (undefined1 (*) [32])(in_RDI + local_368);
    uVar10 = *(undefined8 *)(*pauVar13 + 8);
    uVar11 = *(undefined8 *)(*pauVar13 + 0x10);
    uVar12 = *(undefined8 *)(*pauVar13 + 0x18);
    auVar6._16_8_ = uStack_f0;
    auVar6._0_16_ = auVar2;
    auVar6._24_8_ = uStack_e8;
    auVar6 = vpcmpeqb_avx2(*pauVar13,auVar6);
    auVar7._16_8_ = uStack_b0;
    auVar7._0_16_ = auVar3;
    auVar7._24_8_ = uStack_a8;
    auVar7 = vpcmpeqb_avx2(*pauVar13,auVar7);
    auVar9._16_8_ = uStack_70;
    auVar9._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar9._24_8_ = uStack_68;
    uVar8 = vpcmpeqb_avx512vl(*pauVar13,auVar9);
    auVar9 = vpmovm2b_avx512vl(uVar8);
    auVar6 = vpor_avx2(auVar6,auVar7);
    auVar6 = vpor_avx2(auVar6,auVar9);
    if (auVar6 == (undefined1  [32])0x0) {
      puVar14 = (undefined8 *)(in_RDI + local_2e8);
      *puVar14 = *(undefined8 *)*pauVar13;
      puVar14[1] = uVar10;
      puVar14[2] = uVar11;
      puVar14[3] = uVar12;
      local_2e8 = local_2e8 + 0x20;
    }
    else {
      for (local_428 = 0; local_428 < 0x20; local_428 = local_428 + 1) {
        cVar1 = *(char *)(in_RDI + local_368 + local_428);
        if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
          *(char *)(in_RDI + local_2e8) = cVar1;
          local_2e8 = local_2e8 + 1;
        }
      }
    }
  }
  for (; local_368 < in_RSI; local_368 = local_368 + 1) {
    cVar1 = *(char *)(in_RDI + local_368);
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      *(char *)(in_RDI + local_2e8) = cVar1;
      local_2e8 = local_2e8 + 1;
    }
  }
  return local_2e8;
}

Assistant:

size_t avx2_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m256i spaces = _mm256_set1_epi8(' ');
  __m256i newline = _mm256_set1_epi8('\n');
  __m256i carriage = _mm256_set1_epi8('\r');
  size_t i = 0;
  for (; i + 31 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    // we do it the naive way, could be smarter?
    __m256i xspaces = _mm256_cmpeq_epi8(x, spaces);
    __m256i xnewline = _mm256_cmpeq_epi8(x, newline);
    __m256i xcarriage = _mm256_cmpeq_epi8(x, carriage);
    __m256i anywhite =
        _mm256_or_si256(_mm256_or_si256(xspaces, xnewline), xcarriage);
    if (_mm256_testz_si256(anywhite, anywhite) == 1) { // no white space
      _mm256_storeu_si256((__m256i *)(bytes + pos), x);
      pos += 32;
    } else {
      // do it the hard way
      for (size_t j = 0; j < 32; j++) {
        char c = bytes[i + j];
        if (c == '\r' || c == '\n' || c == ' ') {
          continue;
        }
        bytes[pos++] = c;
      }
    }
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}